

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

Parser * Catch::makeCommandLineParser(Parser *__return_storage_ptr__,ConfigData *config)

{
  Opt *pOVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer p_Var3;
  undefined8 *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_6;
  StringRef optName;
  StringRef optName_00;
  StringRef optName_01;
  StringRef optName_02;
  StringRef optName_03;
  StringRef optName_04;
  StringRef optName_05;
  StringRef optName_06;
  StringRef optName_07;
  StringRef optName_08;
  StringRef optName_09;
  StringRef optName_10;
  StringRef optName_11;
  StringRef optName_12;
  StringRef optName_13;
  StringRef optName_14;
  StringRef optName_15;
  StringRef optName_16;
  StringRef optName_17;
  StringRef optName_18;
  StringRef optName_19;
  StringRef optName_20;
  StringRef optName_21;
  StringRef optName_22;
  StringRef optName_23;
  StringRef optName_24;
  StringRef optName_25;
  StringRef optName_26;
  StringRef optName_27;
  StringRef optName_28;
  StringRef optName_29;
  StringRef optName_30;
  StringRef optName_31;
  StringRef optName_32;
  StringRef optName_33;
  StringRef optName_34;
  StringRef optName_35;
  StringRef optName_36;
  StringRef optName_37;
  StringRef optName_38;
  StringRef optName_39;
  StringRef optName_40;
  StringRef optName_41;
  StringRef optName_42;
  StringRef optName_43;
  StringRef optName_44;
  StringRef optName_45;
  StringRef optName_46;
  StringRef optName_47;
  StringRef optName_48;
  StringRef hint;
  StringRef hint_00;
  StringRef hint_01;
  StringRef hint_02;
  StringRef hint_03;
  StringRef hint_04;
  StringRef hint_05;
  StringRef hint_06;
  StringRef SVar5;
  __allocator_type __a2_12;
  __allocator_type __a2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_19b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_19b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_19a8;
  char *local_19a0;
  size_type local_1998;
  char *local_1990;
  size_type local_1988;
  pointer local_1980;
  pointer pSStack_1978;
  pointer local_1970;
  ExeName local_1968;
  __allocator_type __a2_11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1938 [5];
  char *local_1910;
  size_type local_1908;
  __allocator_type __a2_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_18f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18e8;
  char *local_18e0;
  size_type local_18d8;
  char *local_18d0;
  size_type local_18c8;
  pointer local_18c0;
  pointer pSStack_18b8;
  pointer local_18b0;
  __allocator_type __a2_8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_18a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1898;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1890;
  char *local_1888;
  size_type local_1880;
  char *local_1878;
  size_type local_1870;
  pointer local_1868;
  pointer pSStack_1860;
  pointer local_1858;
  __allocator_type __a2_7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1848 [10];
  undefined1 local_17f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_17f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_17e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_17e0;
  char *local_17d8;
  size_type local_17d0;
  char *local_17c8;
  size_type local_17c0;
  pointer local_17b8;
  pointer pSStack_17b0;
  pointer local_17a8;
  __allocator_type __a2_3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1798;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1790;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1788;
  char *local_1780;
  size_type local_1778;
  char *local_1770;
  size_type local_1768;
  pointer local_1760;
  pointer pSStack_1758;
  pointer local_1750;
  __allocator_type __a2_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1740 [10];
  undefined1 local_16f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_16e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_16e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_16d8;
  char *local_16d0;
  size_type local_16c8;
  char *local_16c0;
  size_type local_16b8;
  pointer local_16b0;
  pointer pSStack_16a8;
  pointer local_16a0;
  undefined1 local_1698 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1690 [10];
  undefined1 local_1640 [8];
  pointer local_1638;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1630;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1628;
  char *local_1620;
  size_type local_1618;
  char *local_1610;
  size_type local_1608;
  pointer local_1600;
  pointer pSStack_15f8;
  pointer local_15f0;
  __allocator_type __a2_9;
  undefined1 local_1590 [8];
  pointer local_1588;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1580;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1578;
  char *local_1570;
  size_type local_1568;
  char *local_1560;
  size_type local_1558;
  pointer local_1550;
  pointer pSStack_1548;
  pointer local_1540;
  __allocator_type __a2_5;
  __allocator_type __a2_4;
  Opt local_1488;
  __allocator_type __a2_10;
  undefined1 local_13d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_13d0 [10];
  Opt local_1380;
  __allocator_type __a2_6;
  undefined1 local_12d0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_12c8 [10];
  undefined1 local_1278 [88];
  undefined1 local_1220 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1218 [10];
  undefined1 local_11c8 [88];
  Opt local_1170;
  Opt local_1118;
  Opt local_10c0;
  Opt local_1068;
  Opt local_1010;
  undefined1 local_fb8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_fb0 [7];
  pointer local_f78;
  pointer pSStack_f70;
  pointer local_f68;
  Opt local_f60;
  Opt local_f08;
  Opt local_eb0;
  Opt local_e58;
  Opt local_e00;
  Opt local_da8;
  Parser local_d50;
  Parser local_cf0;
  Parser local_c90;
  Parser local_c30;
  Parser local_bd0;
  Parser local_b70;
  Parser local_b10;
  Parser local_ab0;
  Parser local_a50;
  Parser local_9f0;
  Parser local_990;
  Parser local_930;
  Parser local_8d0;
  Parser local_870;
  Parser local_810;
  Parser local_7b0;
  Parser local_750;
  Parser local_6f0;
  Parser local_690;
  Parser local_630;
  Parser local_5d0;
  Parser local_570;
  Parser local_510;
  Parser local_4b0;
  Parser local_450;
  Parser local_3f0;
  Parser local_390;
  Parser local_330;
  Parser local_2d0;
  Parser local_270;
  Parser local_210;
  Parser local_1b0;
  Parser local_150;
  Parser local_f0;
  Parser local_90;
  
  Clara::ExeName::ExeName(&local_1968,&config->processName);
  Clara::Help::Help((Help *)&local_da8,&config->showHelp);
  Clara::Detail::ComposableParserImpl<Catch::Clara::ExeName>::operator|
            (&local_d50,&local_1968.super_ComposableParserImpl<Catch::Clara::ExeName>,
             (Help *)&local_da8);
  Clara::Opt::Opt(&local_e00,&config->showSuccessfulTests);
  optName.m_size = 2;
  optName.m_start = "-s";
  pOVar1 = Clara::Opt::operator[](&local_e00,optName);
  optName_00.m_size = 9;
  optName_00.m_start = "--success";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_00);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "include successful tests in output";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x22;
  Clara::operator|(&local_cf0,&local_d50,pOVar1);
  Clara::Opt::Opt(&local_e58,&config->shouldDebugBreak);
  optName_01.m_size = 2;
  optName_01.m_start = "-b";
  pOVar1 = Clara::Opt::operator[](&local_e58,optName_01);
  optName_02.m_size = 7;
  optName_02.m_start = "--break";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_02);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "break into debugger on failure";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x1e;
  Clara::operator|(&local_c90,&local_cf0,pOVar1);
  Clara::Opt::Opt(&local_eb0,&config->noThrow);
  optName_03.m_size = 2;
  optName_03.m_start = "-e";
  pOVar1 = Clara::Opt::operator[](&local_eb0,optName_03);
  optName_04.m_size = 9;
  optName_04.m_start = "--nothrow";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_04);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "skip exception tests";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x14;
  Clara::operator|(&local_c30,&local_c90,pOVar1);
  Clara::Opt::Opt(&local_f08,&config->showInvisibles);
  optName_05.m_size = 2;
  optName_05.m_start = "-i";
  pOVar1 = Clara::Opt::operator[](&local_f08,optName_05);
  optName_06.m_size = 0xc;
  optName_06.m_start = "--invisibles";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_06);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "show invisibles (tabs, newlines)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x20;
  Clara::operator|(&local_bd0,&local_c30,pOVar1);
  hint.m_size = 8;
  hint.m_start = "filename";
  Clara::Opt::Opt<std::__cxx11::string,void>(&local_f60,&config->defaultOutputFilename,hint);
  optName_07.m_size = 2;
  optName_07.m_start = "-o";
  pOVar1 = Clara::Opt::operator[](&local_f60,optName_07);
  optName_08.m_size = 5;
  optName_08.m_start = "--out";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_08);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "default output filename"
  ;
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x17;
  Clara::operator|(&local_b70,&local_bd0,pOVar1);
  local_1170.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001a74f0;
  local_1170.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_11c8._0_8_ = &__a2;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a6770;
  *(ConfigData **)&p_Var2[1]._M_use_count = config;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a67c0;
  local_11c8._8_8_ = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundManyLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3183:34)>,_std::allocator<Catch::Clara::Detail::BoundManyLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3183:34)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundManyLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3183:34)>,_std::allocator<Catch::Clara::Detail::BoundManyLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3183:34)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_11c8);
  local_fb8 = (undefined1  [8])0x0;
  a_Stack_fb0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1170.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  local_1170.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_fb0);
  local_1170.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "name[::key=value]*";
  local_1170.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0x12;
  local_1170.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1170.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_1170.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001a4460;
  local_1170.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1170.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1170.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_09.m_size = 2;
  optName_09.m_start = "-r";
  pOVar1 = Clara::Opt::operator[](&local_1170,optName_09);
  optName_10.m_size = 10;
  optName_10.m_start = "--reporter";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_10);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "reporter to use (defaults to console)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x25;
  Clara::operator|(&local_b10,&local_b70,pOVar1);
  hint_00.m_size = 4;
  hint_00.m_start = "name";
  Clara::Opt::Opt<std::__cxx11::string,void>((Opt *)local_11c8,&config->name,hint_00);
  optName_11.m_size = 2;
  optName_11.m_start = "-n";
  pOVar1 = Clara::Opt::operator[]((Opt *)local_11c8,optName_11);
  optName_12.m_size = 6;
  optName_12.m_start = "--name";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_12);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "suite name";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 10;
  Clara::operator|(&local_ab0,&local_b10,pOVar1);
  p_Var3 = (pointer)operator_new(0x20);
  ___a2 = (undefined **)&__a2_1;
  (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001a6828;
  (p_Var3->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__BoundRef_001a6878;
  *(ConfigData **)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 8) = config;
  local_19b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3277:20)>,_std::allocator<Catch::Clara::Detail::BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3277:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3277:20)>,_std::allocator<Catch::Clara::Detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3277:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2);
  local_16f0 = (undefined1  [8])0x0;
  _Stack_16e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ___a2 = (undefined **)&p_Var3->_M_impl;
  local_19b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::ParserRefImpl
            ((ParserRefImpl<Catch::Clara::Opt> *)local_fb8,
             (shared_ptr<Catch::Clara::Detail::BoundRef> *)&__a2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_19b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_16e8);
  local_fb8 = (undefined1  [8])&PTR__Opt_001a4460;
  local_f78 = (pointer)0x0;
  pSStack_f70 = (pointer)0x0;
  local_f68 = (pointer)0x0;
  optName_13.m_size = 2;
  optName_13.m_start = "-a";
  pOVar1 = Clara::Opt::operator[]((Opt *)local_fb8,optName_13);
  optName_14.m_size = 7;
  optName_14.m_start = "--abort";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_14);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "abort at first failure";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x16;
  Clara::operator|(&local_a50,&local_ab0,pOVar1);
  ___a2 = &PTR__ParserRefImpl_001a74f0;
  local_19b8._M_pi = local_19b8._M_pi & 0xffffffff00000000;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_16f0 = (undefined1  [8])&__a2_2;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a68c8;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a6918;
  *(ConfigData **)&p_Var2[1]._M_use_count = config;
  _Stack_16e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3280:20)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3280:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3280:20)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3280:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_16f0);
  ___a2_1 = (_func_int **)0x0;
  _Stack_18f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_19b0 = p_Var2 + 1;
  local_19a8._M_pi = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_18f8);
  local_19a0 = "no. failures";
  local_1998 = 0xc;
  local_1990 = "";
  local_1988 = 0;
  ___a2 = &PTR__Opt_001a4460;
  local_1980 = (pointer)0x0;
  pSStack_1978 = (pointer)0x0;
  local_1970 = (pointer)0x0;
  optName_15.m_size = 2;
  optName_15.m_start = "-x";
  pOVar1 = Clara::Opt::operator[]((Opt *)&__a2,optName_15);
  optName_16.m_size = 8;
  optName_16.m_start = "--abortx";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_16);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "abort after x failures";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x16;
  Clara::operator|(&local_9f0,&local_a50,pOVar1);
  local_16f0 = (undefined1  [8])&PTR__ParserRefImpl_001a74f0;
  _Stack_16e8._M_pi = _Stack_16e8._M_pi & 0xffffffff00000000;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_1 = (undefined **)&__a2_3;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a6968;
  *(ConfigData **)&p_Var2[1]._M_use_count = config;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a69b8;
  _Stack_18f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundManyLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3078:33)>,_std::allocator<Catch::Clara::Detail::BoundManyLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3078:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundManyLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3078:33)>,_std::allocator<Catch::Clara::Detail::BoundManyLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3078:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_1);
  ___a2_2 = (_func_int **)0x0;
  a_Stack_1740[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_16e0 = p_Var2 + 1;
  local_16d8._M_pi = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1740);
  local_16d0 = "warning name";
  local_16c8 = 0xc;
  local_16c0 = "";
  local_16b8 = 0;
  local_16f0 = (undefined1  [8])&PTR__Opt_001a4460;
  local_16b0 = (pointer)0x0;
  pSStack_16a8 = (pointer)0x0;
  local_16a0 = (pointer)0x0;
  optName_17.m_size = 2;
  optName_17.m_start = "-w";
  pOVar1 = Clara::Opt::operator[]((Opt *)local_16f0,optName_17);
  optName_18.m_size = 6;
  optName_18.m_start = "--warn";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_18);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "enable warnings";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0xf;
  Clara::operator|(&local_990,&local_9f0,pOVar1);
  ___a2_1 = &PTR__ParserRefImpl_001a74f0;
  _Stack_18f8._M_pi = _Stack_18f8._M_pi & 0xffffffff00000000;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_2 = (_func_int **)&__a2_4;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a6a20;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a6a70;
  *(ConfigData **)&p_Var2[1]._M_use_count = config;
  a_Stack_1740[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3286:20)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3286:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3286:20)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3286:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_2);
  ___a2_3 = (_func_int **)0x0;
  _Stack_1798._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_18f0 = p_Var2 + 1;
  local_18e8._M_pi = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1798);
  local_18e0 = "yes|no";
  local_18d8 = 6;
  local_18d0 = "";
  local_18c8 = 0;
  ___a2_1 = &PTR__Opt_001a4460;
  local_18c0 = (pointer)0x0;
  pSStack_18b8 = (pointer)0x0;
  local_18b0 = (pointer)0x0;
  optName_19.m_size = 2;
  optName_19.m_start = "-d";
  pOVar1 = Clara::Opt::operator[]((Opt *)&__a2_1,optName_19);
  optName_20.m_size = 0xb;
  optName_20.m_start = "--durations";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_20);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "show test durations";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x13;
  Clara::operator|(&local_930,&local_990,pOVar1);
  hint_01.m_size = 7;
  hint_01.m_start = "seconds";
  Clara::Opt::Opt<double,void>((Opt *)&__a2_2,&config->minDuration,hint_01);
  optName_21.m_size = 2;
  optName_21.m_start = "-D";
  pOVar1 = Clara::Opt::operator[]((Opt *)&__a2_2,optName_21);
  optName_22.m_size = 0xe;
  optName_22.m_start = "--min-duration";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_22);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "show test durations for tests taking at least the given number of seconds";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x49;
  Clara::operator|(&local_8d0,&local_930,pOVar1);
  ___a2_3 = &PTR__ParserRefImpl_001a74f0;
  _Stack_1798._M_pi = _Stack_1798._M_pi & 0xffffffff00000000;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_4 = (_func_int **)&__a2_5;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a6ac0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a6b10;
  *(ConfigData **)&p_Var2[1]._M_use_count = config;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3090:44)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3090:44)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3090:44)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3090:44)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_4);
  local_1220 = (undefined1  [8])0x0;
  a_Stack_1218[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1790 = p_Var2 + 1;
  local_1788._M_pi = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1218);
  local_1780 = "filename";
  local_1778 = 8;
  local_1770 = "";
  local_1768 = 0;
  ___a2_3 = &PTR__Opt_001a4460;
  local_1760 = (pointer)0x0;
  pSStack_1758 = (pointer)0x0;
  local_1750 = (pointer)0x0;
  optName_23.m_size = 2;
  optName_23.m_start = "-f";
  pOVar1 = Clara::Opt::operator[]((Opt *)&__a2_3,optName_23);
  optName_24.m_size = 0xc;
  optName_24.m_start = "--input-file";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_24);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "load test names to run from a file";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x22;
  Clara::operator|(&local_870,&local_8d0,pOVar1);
  Clara::Opt::Opt((Opt *)&__a2_4,&config->filenamesAsTags);
  optName_25.m_size = 2;
  optName_25.m_start = "-#";
  pOVar1 = Clara::Opt::operator[]((Opt *)&__a2_4,optName_25);
  optName_26.m_size = 0x13;
  optName_26.m_start = "--filenames-as-tags";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_26);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "adds a tag for the filename";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x1b;
  Clara::operator|(&local_810,&local_870,pOVar1);
  hint_02.m_size = 0xc;
  hint_02.m_start = "section name";
  Clara::Opt::Opt<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((Opt *)local_1220,&config->sectionsToRun,hint_02);
  optName_27.m_size = 2;
  optName_27.m_start = "-c";
  pOVar1 = Clara::Opt::operator[]((Opt *)local_1220,optName_27);
  optName_28.m_size = 9;
  optName_28.m_start = "--section";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_28);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "specify section to run";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x16;
  Clara::operator|(&local_7b0,&local_810,pOVar1);
  ___a2_5 = &PTR__ParserRefImpl_001a74f0;
  puVar4 = (undefined8 *)operator_new(0x20);
  local_1278._0_8_ = &__a2_6;
  puVar4[1] = 0x100000001;
  *puVar4 = &PTR___Sp_counted_ptr_inplace_001a6b60;
  puVar4[2] = &PTR__BoundRef_001a6bb0;
  puVar4[3] = config;
  local_1278._8_8_ = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3171:35)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3171:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3171:35)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3171:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1278);
  local_12d0 = (undefined1  [8])0x0;
  a_Stack_12c8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_12c8);
  ___a2_5 = &PTR__Opt_001a4460;
  optName_29.m_size = 2;
  optName_29.m_start = "-v";
  pOVar1 = Clara::Opt::operator[]((Opt *)&__a2_5,optName_29);
  optName_30.m_size = 0xb;
  optName_30.m_start = "--verbosity";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_30);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "set output verbosity";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x14;
  Clara::operator|(&local_750,&local_7b0,pOVar1);
  Clara::Opt::Opt((Opt *)local_1278,&config->listTests);
  optName_31.m_size = 0xc;
  optName_31.m_start = "--list-tests";
  pOVar1 = Clara::Opt::operator[]((Opt *)local_1278,optName_31);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "list all/matching test cases";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x1c;
  Clara::operator|(&local_6f0,&local_750,pOVar1);
  Clara::Opt::Opt((Opt *)local_12d0,&config->listTags);
  optName_32.m_size = 0xb;
  optName_32.m_start = "--list-tags";
  pOVar1 = Clara::Opt::operator[]((Opt *)local_12d0,optName_32);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "list all/matching tags";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x16;
  Clara::operator|(&local_690,&local_6f0,pOVar1);
  Clara::Opt::Opt((Opt *)&__a2_6,&config->listReporters);
  optName_33.m_size = 0x10;
  optName_33.m_start = "--list-reporters";
  pOVar1 = Clara::Opt::operator[]((Opt *)&__a2_6,optName_33);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "list all available reporters";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x1c;
  Clara::operator|(&local_630,&local_690,pOVar1);
  Clara::Opt::Opt(&local_1010,&config->listListeners);
  optName_34.m_size = 0x10;
  optName_34.m_start = "--list-listeners";
  pOVar1 = Clara::Opt::operator[](&local_1010,optName_34);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "list all listeners";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x12;
  Clara::operator|(&local_5d0,&local_630,pOVar1);
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001a74f0;
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_1590 = (undefined1  [8])&__a2_7;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a6c00;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a6c50;
  *(ConfigData **)&p_Var2[1]._M_use_count = config;
  local_1588 = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3111:35)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3111:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3111:35)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3111:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1590);
  local_17f8 = (undefined1  [8])0x0;
  _Stack_17f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_17f0);
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "decl|lex|rand";
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0xd;
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001a4460;
  local_1380.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1380.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1380.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_35.m_size = 7;
  optName_35.m_start = "--order";
  pOVar1 = Clara::Opt::operator[](&local_1380,optName_35);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "test case order (defaults to decl)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x22;
  Clara::operator|(&local_570,&local_5d0,pOVar1);
  local_1590 = (undefined1  [8])&PTR__ParserRefImpl_001a74f0;
  local_1588 = (pointer)((ulong)local_1588 & 0xffffffff00000000);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_17f8 = (undefined1  [8])&__a2_8;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a6ca0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a6cf0;
  *(ConfigData **)&p_Var2[1]._M_use_count = config;
  _Stack_17f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3122:33)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3122:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3122:33)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3122:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_17f8);
  ___a2_7 = (_func_int **)0x0;
  a_Stack_1848[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1580 = p_Var2 + 1;
  local_1578._M_pi = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1848);
  local_1570 = "\'time\'|\'random-device\'|number";
  local_1568 = 0x1d;
  local_1560 = "";
  local_1558 = 0;
  local_1590 = (undefined1  [8])&PTR__Opt_001a4460;
  local_1550 = (pointer)0x0;
  pSStack_1548 = (pointer)0x0;
  local_1540 = (pointer)0x0;
  optName_36.m_size = 10;
  optName_36.m_start = "--rng-seed";
  pOVar1 = Clara::Opt::operator[]((Opt *)local_1590,optName_36);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "set a specific seed for random numbers";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x26;
  Clara::operator|(&local_510,&local_570,pOVar1);
  local_17f8 = (undefined1  [8])&PTR__ParserRefImpl_001a74f0;
  _Stack_17f0._M_pi = _Stack_17f0._M_pi & 0xffffffff00000000;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_7 = (_func_int **)&__a2_9;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a6d40;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a6d90;
  *(ConfigData **)&p_Var2[1]._M_use_count = config;
  a_Stack_1848[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3140:43)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3140:43)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3140:43)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3140:43)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_7);
  ___a2_8 = (_func_int **)0x0;
  _Stack_18a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_17e8 = p_Var2 + 1;
  local_17e0._M_pi = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_18a0);
  local_17d8 = "ansi|win32|none|default";
  local_17d0 = 0x17;
  local_17c8 = "";
  local_17c0 = 0;
  local_17f8 = (undefined1  [8])&PTR__Opt_001a4460;
  local_17b8 = (pointer)0x0;
  pSStack_17b0 = (pointer)0x0;
  local_17a8 = (pointer)0x0;
  optName_37.m_size = 0xd;
  optName_37.m_start = "--colour-mode";
  pOVar1 = Clara::Opt::operator[]((Opt *)local_17f8,optName_37);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "what color mode should be used as default";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x29;
  Clara::operator|(&local_4b0,&local_510,pOVar1);
  Clara::Opt::Opt((Opt *)&__a2_7,&config->libIdentify);
  optName_38.m_size = 0xd;
  optName_38.m_start = "--libidentify";
  pOVar1 = Clara::Opt::operator[]((Opt *)&__a2_7,optName_38);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "report name and version according to libidentify standard";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x39;
  Clara::operator|(&local_450,&local_4b0,pOVar1);
  ___a2_8 = &PTR__ParserRefImpl_001a74f0;
  _Stack_18a0._M_pi = _Stack_18a0._M_pi & 0xffffffff00000000;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_9 = (_func_int **)&__a2_10;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a6de0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a6e30;
  *(ConfigData **)&p_Var2[1]._M_use_count = config;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3157:41)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3157:41)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3157:41)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3157:41)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_9);
  local_13d8 = (undefined1  [8])0x0;
  a_Stack_13d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1898 = p_Var2 + 1;
  local_1890._M_pi = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_13d0);
  local_1888 = "never|start|exit|both";
  local_1880 = 0x15;
  local_1878 = "";
  local_1870 = 0;
  ___a2_8 = &PTR__Opt_001a4460;
  local_1868 = (pointer)0x0;
  pSStack_1860 = (pointer)0x0;
  local_1858 = (pointer)0x0;
  optName_39.m_size = 0x13;
  optName_39.m_start = "--wait-for-keypress";
  pOVar1 = Clara::Opt::operator[]((Opt *)&__a2_8,optName_39);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "waits for a keypress before exiting";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x23;
  Clara::operator|(&local_3f0,&local_450,pOVar1);
  Clara::Opt::Opt((Opt *)&__a2_9,&config->skipBenchmarks);
  optName_40.m_size = 0x11;
  optName_40.m_start = "--skip-benchmarks";
  pOVar1 = Clara::Opt::operator[]((Opt *)&__a2_9,optName_40);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "disable running benchmarks";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x1a;
  Clara::operator|(&local_390,&local_3f0,pOVar1);
  hint_03.m_size = 7;
  hint_03.m_start = "samples";
  Clara::Opt::Opt<unsigned_int,void>((Opt *)local_13d8,&config->benchmarkSamples,hint_03);
  optName_41.m_size = 0x13;
  optName_41.m_start = "--benchmark-samples";
  pOVar1 = Clara::Opt::operator[]((Opt *)local_13d8,optName_41);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "number of samples to collect (default: 100)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x2b;
  Clara::operator|(&local_330,&local_390,pOVar1);
  hint_04.m_size = 9;
  hint_04.m_start = "resamples";
  Clara::Opt::Opt<unsigned_int,void>((Opt *)&__a2_10,&config->benchmarkResamples,hint_04);
  optName_42.m_size = 0x15;
  optName_42.m_start = "--benchmark-resamples";
  pOVar1 = Clara::Opt::operator[]((Opt *)&__a2_10,optName_42);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "number of resamples for the bootstrap (default: 100000)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x37;
  Clara::operator|(&local_2d0,&local_330,pOVar1);
  hint_05.m_size = 0x13;
  hint_05.m_start = "confidence interval";
  Clara::Opt::Opt<double,void>(&local_1068,&config->benchmarkConfidenceInterval,hint_05);
  optName_43.m_size = 0x1f;
  optName_43.m_start = "--benchmark-confidence-interval";
  pOVar1 = Clara::Opt::operator[](&local_1068,optName_43);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "confidence interval for the bootstrap (between 0 and 1, default: 0.95)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x46;
  Clara::operator|(&local_270,&local_2d0,pOVar1);
  Clara::Opt::Opt(&local_10c0,&config->benchmarkNoAnalysis);
  optName_44.m_size = 0x17;
  optName_44.m_start = "--benchmark-no-analysis";
  pOVar1 = Clara::Opt::operator[](&local_10c0,optName_44);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "perform only measurements; do not perform any analysis";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x36;
  Clara::operator|(&local_210,&local_270,pOVar1);
  hint_06.m_size = 0x13;
  hint_06.m_start = "benchmarkWarmupTime";
  Clara::Opt::Opt<long,void>(&local_1118,&config->benchmarkWarmupTime,hint_06);
  optName_45.m_size = 0x17;
  optName_45.m_start = "--benchmark-warmup-time";
  pOVar1 = Clara::Opt::operator[](&local_1118,optName_45);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "amount of time in milliseconds spent on warming up each test (default: 100)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x4b;
  Clara::operator|(&local_1b0,&local_210,pOVar1);
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001a74f0;
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_1640 = (undefined1  [8])&__a2_11;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a6e80;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a6ed0;
  *(ConfigData **)&p_Var2[1]._M_use_count = config;
  local_1638 = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3229:36)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3229:36)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3229:36)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3229:36)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1640);
  local_1698 = (undefined1  [8])0x0;
  a_Stack_1690[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1690);
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "shard count";
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0xb;
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001a4460;
  local_1488.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1488.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1488.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_46.m_size = 0xd;
  optName_46.m_start = "--shard-count";
  pOVar1 = Clara::Opt::operator[](&local_1488,optName_46);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "split the tests to execute into this many groups";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x30;
  Clara::operator|(&local_150,&local_1b0,pOVar1);
  local_1640 = (undefined1  [8])&PTR__ParserRefImpl_001a74f0;
  local_1638 = (pointer)((ulong)local_1638 & 0xffffffff00000000);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_1698 = (undefined1  [8])&__a2_12;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a6f20;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a6f70;
  *(ConfigData **)&p_Var2[1]._M_use_count = config;
  a_Stack_1690[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3243:36)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3243:36)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3243:36)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3243:36)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1698);
  ___a2_11 = (_func_int **)0x0;
  a_Stack_1938[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1630 = p_Var2 + 1;
  local_1628._M_pi = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1938);
  local_1620 = "shard index";
  local_1618 = 0xb;
  local_1610 = "";
  local_1608 = 0;
  local_1640 = (undefined1  [8])&PTR__Opt_001a4460;
  local_1600 = (pointer)0x0;
  pSStack_15f8 = (pointer)0x0;
  local_15f0 = (pointer)0x0;
  optName_47.m_size = 0xd;
  optName_47.m_start = "--shard-index";
  pOVar1 = Clara::Opt::operator[]((Opt *)local_1640,optName_47);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "index of the group of tests to execute (see --shard-count)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x3a;
  Clara::operator|(&local_f0,&local_150,pOVar1);
  Clara::Opt::Opt((Opt *)local_1698,&config->allowZeroTests);
  optName_48.m_size = 0x18;
  optName_48.m_start = "--allow-running-no-tests";
  pOVar1 = Clara::Opt::operator[]((Opt *)local_1698,optName_48);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "Treat \'No tests run\' as a success";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x21;
  Clara::operator|(&local_90,&local_f0,pOVar1);
  SVar5.m_size = 0x16;
  SVar5.m_start = "test name|pattern|tags";
  Clara::Arg::
  ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::char_traits<char>>>,void>
            ((Arg *)&__a2_11,&config->testsOrTags,SVar5);
  local_1910 = "which test or tests to use";
  local_1908 = 0x1a;
  Clara::operator|(__return_storage_ptr__,&local_90,(Arg *)&__a2_11);
  Clara::Detail::ParserRefImpl<Catch::Clara::Arg>::~ParserRefImpl
            ((ParserRefImpl<Catch::Clara::Arg> *)&__a2_11);
  Clara::Parser::~Parser(&local_90);
  Clara::Opt::~Opt((Opt *)local_1698);
  Clara::Parser::~Parser(&local_f0);
  Clara::Opt::~Opt((Opt *)local_1640);
  Clara::Parser::~Parser(&local_150);
  Clara::Opt::~Opt(&local_1488);
  Clara::Parser::~Parser(&local_1b0);
  Clara::Opt::~Opt(&local_1118);
  Clara::Parser::~Parser(&local_210);
  Clara::Opt::~Opt(&local_10c0);
  Clara::Parser::~Parser(&local_270);
  Clara::Opt::~Opt(&local_1068);
  Clara::Parser::~Parser(&local_2d0);
  Clara::Opt::~Opt((Opt *)&__a2_10);
  Clara::Parser::~Parser(&local_330);
  Clara::Opt::~Opt((Opt *)local_13d8);
  Clara::Parser::~Parser(&local_390);
  Clara::Opt::~Opt((Opt *)&__a2_9);
  Clara::Parser::~Parser(&local_3f0);
  Clara::Opt::~Opt((Opt *)&__a2_8);
  Clara::Parser::~Parser(&local_450);
  Clara::Opt::~Opt((Opt *)&__a2_7);
  Clara::Parser::~Parser(&local_4b0);
  Clara::Opt::~Opt((Opt *)local_17f8);
  Clara::Parser::~Parser(&local_510);
  Clara::Opt::~Opt((Opt *)local_1590);
  Clara::Parser::~Parser(&local_570);
  Clara::Opt::~Opt(&local_1380);
  Clara::Parser::~Parser(&local_5d0);
  Clara::Opt::~Opt(&local_1010);
  Clara::Parser::~Parser(&local_630);
  Clara::Opt::~Opt((Opt *)&__a2_6);
  Clara::Parser::~Parser(&local_690);
  Clara::Opt::~Opt((Opt *)local_12d0);
  Clara::Parser::~Parser(&local_6f0);
  Clara::Opt::~Opt((Opt *)local_1278);
  Clara::Parser::~Parser(&local_750);
  Clara::Opt::~Opt((Opt *)&__a2_5);
  Clara::Parser::~Parser(&local_7b0);
  Clara::Opt::~Opt((Opt *)local_1220);
  Clara::Parser::~Parser(&local_810);
  Clara::Opt::~Opt((Opt *)&__a2_4);
  Clara::Parser::~Parser(&local_870);
  Clara::Opt::~Opt((Opt *)&__a2_3);
  Clara::Parser::~Parser(&local_8d0);
  Clara::Opt::~Opt((Opt *)&__a2_2);
  Clara::Parser::~Parser(&local_930);
  Clara::Opt::~Opt((Opt *)&__a2_1);
  Clara::Parser::~Parser(&local_990);
  Clara::Opt::~Opt((Opt *)local_16f0);
  Clara::Parser::~Parser(&local_9f0);
  Clara::Opt::~Opt((Opt *)&__a2);
  Clara::Parser::~Parser(&local_a50);
  Clara::Opt::~Opt((Opt *)local_fb8);
  Clara::Parser::~Parser(&local_ab0);
  Clara::Opt::~Opt((Opt *)local_11c8);
  Clara::Parser::~Parser(&local_b10);
  Clara::Opt::~Opt(&local_1170);
  Clara::Parser::~Parser(&local_b70);
  Clara::Opt::~Opt(&local_f60);
  Clara::Parser::~Parser(&local_bd0);
  Clara::Opt::~Opt(&local_f08);
  Clara::Parser::~Parser(&local_c30);
  Clara::Opt::~Opt(&local_eb0);
  Clara::Parser::~Parser(&local_c90);
  Clara::Opt::~Opt(&local_e58);
  Clara::Parser::~Parser(&local_cf0);
  Clara::Opt::~Opt(&local_e00);
  Clara::Parser::~Parser(&local_d50);
  Clara::Opt::~Opt(&local_da8);
  Clara::ExeName::~ExeName(&local_1968);
  return __return_storage_ptr__;
}

Assistant:

Clara::Parser makeCommandLineParser( ConfigData& config ) {

        using namespace Clara;

        auto const setWarning = [&]( std::string const& warning ) {
            if ( warning == "NoAssertions" ) {
                config.warnings = static_cast<WarnAbout::What>(config.warnings | WarnAbout::NoAssertions);
                return ParserResult::ok( ParseResultType::Matched );
            } else if ( warning == "UnmatchedTestSpec" ) {
                config.warnings = static_cast<WarnAbout::What>(config.warnings | WarnAbout::UnmatchedTestSpec);
                return ParserResult::ok( ParseResultType::Matched );
            }

            return ParserResult ::runtimeError(
                "Unrecognised warning option: '" + warning + '\'' );
        };
        auto const loadTestNamesFromFile = [&]( std::string const& filename ) {
                std::ifstream f( filename.c_str() );
                if( !f.is_open() )
                    return ParserResult::runtimeError( "Unable to load input file: '" + filename + '\'' );

                std::string line;
                while( std::getline( f, line ) ) {
                    line = trim(line);
                    if( !line.empty() && !startsWith( line, '#' ) ) {
                        if( !startsWith( line, '"' ) )
                            line = '"' + CATCH_MOVE(line) + '"';
                        config.testsOrTags.push_back( line );
                        config.testsOrTags.emplace_back( "," );
                    }
                }
                //Remove comma in the end
                if(!config.testsOrTags.empty())
                    config.testsOrTags.erase( config.testsOrTags.end()-1 );

                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setTestOrder = [&]( std::string const& order ) {
                if( startsWith( "declared", order ) )
                    config.runOrder = TestRunOrder::Declared;
                else if( startsWith( "lexical", order ) )
                    config.runOrder = TestRunOrder::LexicographicallySorted;
                else if( startsWith( "random", order ) )
                    config.runOrder = TestRunOrder::Randomized;
                else
                    return ParserResult::runtimeError( "Unrecognised ordering: '" + order + '\'' );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setRngSeed = [&]( std::string const& seed ) {
                if( seed == "time" ) {
                    config.rngSeed = generateRandomSeed(GenerateFrom::Time);
                    return ParserResult::ok(ParseResultType::Matched);
                } else if (seed == "random-device") {
                    config.rngSeed = generateRandomSeed(GenerateFrom::RandomDevice);
                    return ParserResult::ok(ParseResultType::Matched);
                }

                // TODO: ideally we should be parsing uint32_t directly
                //       fix this later when we add new parse overload
                auto parsedSeed = parseUInt( seed, 0 );
                if ( !parsedSeed ) {
                    return ParserResult::runtimeError( "Could not parse '" + seed + "' as seed" );
                }
                config.rngSeed = *parsedSeed;
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setDefaultColourMode = [&]( std::string const& colourMode ) {
            Optional<ColourMode> maybeMode = Catch::Detail::stringToColourMode(toLower( colourMode ));
            if ( !maybeMode ) {
                return ParserResult::runtimeError(
                    "colour mode must be one of: default, ansi, win32, "
                    "or none. '" +
                    colourMode + "' is not recognised" );
            }
            auto mode = *maybeMode;
            if ( !isColourImplAvailable( mode ) ) {
                return ParserResult::runtimeError(
                    "colour mode '" + colourMode +
                    "' is not supported in this binary" );
            }
            config.defaultColourMode = mode;
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setWaitForKeypress = [&]( std::string const& keypress ) {
                auto keypressLc = toLower( keypress );
                if (keypressLc == "never")
                    config.waitForKeypress = WaitForKeypress::Never;
                else if( keypressLc == "start" )
                    config.waitForKeypress = WaitForKeypress::BeforeStart;
                else if( keypressLc == "exit" )
                    config.waitForKeypress = WaitForKeypress::BeforeExit;
                else if( keypressLc == "both" )
                    config.waitForKeypress = WaitForKeypress::BeforeStartAndExit;
                else
                    return ParserResult::runtimeError( "keypress argument must be one of: never, start, exit or both. '" + keypress + "' not recognised" );
            return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setVerbosity = [&]( std::string const& verbosity ) {
            auto lcVerbosity = toLower( verbosity );
            if( lcVerbosity == "quiet" )
                config.verbosity = Verbosity::Quiet;
            else if( lcVerbosity == "normal" )
                config.verbosity = Verbosity::Normal;
            else if( lcVerbosity == "high" )
                config.verbosity = Verbosity::High;
            else
                return ParserResult::runtimeError( "Unrecognised verbosity, '" + verbosity + '\'' );
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setReporter = [&]( std::string const& userReporterSpec ) {
            if ( userReporterSpec.empty() ) {
                return ParserResult::runtimeError( "Received empty reporter spec." );
            }

            Optional<ReporterSpec> parsed =
                parseReporterSpec( userReporterSpec );
            if ( !parsed ) {
                return ParserResult::runtimeError(
                    "Could not parse reporter spec '" + userReporterSpec +
                    "'" );
            }

            auto const& reporterSpec = *parsed;

            auto const& factories =
                getRegistryHub().getReporterRegistry().getFactories();
            auto result = factories.find( reporterSpec.name() );

            if ( result == factories.end() ) {
                return ParserResult::runtimeError(
                    "Unrecognized reporter, '" + reporterSpec.name() +
                    "'. Check available with --list-reporters" );
            }


            const bool hadOutputFile = reporterSpec.outputFile().some();
            config.reporterSpecifications.push_back( CATCH_MOVE( *parsed ) );
            // It would be enough to check this only once at the very end, but
            // there is  not a place where we could call this check, so do it
            // every time it could fail. For valid inputs, this is still called
            // at most once.
            if (!hadOutputFile) {
                int n_reporters_without_file = 0;
                for (auto const& spec : config.reporterSpecifications) {
                    if (spec.outputFile().none()) {
                        n_reporters_without_file++;
                    }
                }
                if (n_reporters_without_file > 1) {
                    return ParserResult::runtimeError( "Only one reporter may have unspecified output file." );
                }
            }

            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setShardCount = [&]( std::string const& shardCount ) {
            auto parsedCount = parseUInt( shardCount );
            if ( !parsedCount ) {
                return ParserResult::runtimeError(
                    "Could not parse '" + shardCount + "' as shard count" );
            }
            if ( *parsedCount == 0 ) {
                return ParserResult::runtimeError(
                    "Shard count must be positive" );
            }
            config.shardCount = *parsedCount;
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto const setShardIndex = [&](std::string const& shardIndex) {
            auto parsedIndex = parseUInt( shardIndex );
            if ( !parsedIndex ) {
                return ParserResult::runtimeError(
                    "Could not parse '" + shardIndex + "' as shard index" );
            }
            config.shardIndex = *parsedIndex;
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto cli
            = ExeName( config.processName )
            | Help( config.showHelp )
            | Opt( config.showSuccessfulTests )
                ["-s"]["--success"]
                ( "include successful tests in output" )
            | Opt( config.shouldDebugBreak )
                ["-b"]["--break"]
                ( "break into debugger on failure" )
            | Opt( config.noThrow )
                ["-e"]["--nothrow"]
                ( "skip exception tests" )
            | Opt( config.showInvisibles )
                ["-i"]["--invisibles"]
                ( "show invisibles (tabs, newlines)" )
            | Opt( config.defaultOutputFilename, "filename" )
                ["-o"]["--out"]
                ( "default output filename" )
            | Opt( accept_many, setReporter, "name[::key=value]*" )
                ["-r"]["--reporter"]
                ( "reporter to use (defaults to console)" )
            | Opt( config.name, "name" )
                ["-n"]["--name"]
                ( "suite name" )
            | Opt( [&]( bool ){ config.abortAfter = 1; } )
                ["-a"]["--abort"]
                ( "abort at first failure" )
            | Opt( [&]( int x ){ config.abortAfter = x; }, "no. failures" )
                ["-x"]["--abortx"]
                ( "abort after x failures" )
            | Opt( accept_many, setWarning, "warning name" )
                ["-w"]["--warn"]
                ( "enable warnings" )
            | Opt( [&]( bool flag ) { config.showDurations = flag ? ShowDurations::Always : ShowDurations::Never; }, "yes|no" )
                ["-d"]["--durations"]
                ( "show test durations" )
            | Opt( config.minDuration, "seconds" )
                ["-D"]["--min-duration"]
                ( "show test durations for tests taking at least the given number of seconds" )
            | Opt( loadTestNamesFromFile, "filename" )
                ["-f"]["--input-file"]
                ( "load test names to run from a file" )
            | Opt( config.filenamesAsTags )
                ["-#"]["--filenames-as-tags"]
                ( "adds a tag for the filename" )
            | Opt( config.sectionsToRun, "section name" )
                ["-c"]["--section"]
                ( "specify section to run" )
            | Opt( setVerbosity, "quiet|normal|high" )
                ["-v"]["--verbosity"]
                ( "set output verbosity" )
            | Opt( config.listTests )
                ["--list-tests"]
                ( "list all/matching test cases" )
            | Opt( config.listTags )
                ["--list-tags"]
                ( "list all/matching tags" )
            | Opt( config.listReporters )
                ["--list-reporters"]
                ( "list all available reporters" )
            | Opt( config.listListeners )
                ["--list-listeners"]
                ( "list all listeners" )
            | Opt( setTestOrder, "decl|lex|rand" )
                ["--order"]
                ( "test case order (defaults to decl)" )
            | Opt( setRngSeed, "'time'|'random-device'|number" )
                ["--rng-seed"]
                ( "set a specific seed for random numbers" )
            | Opt( setDefaultColourMode, "ansi|win32|none|default" )
                ["--colour-mode"]
                ( "what color mode should be used as default" )
            | Opt( config.libIdentify )
                ["--libidentify"]
                ( "report name and version according to libidentify standard" )
            | Opt( setWaitForKeypress, "never|start|exit|both" )
                ["--wait-for-keypress"]
                ( "waits for a keypress before exiting" )
            | Opt( config.skipBenchmarks)
                ["--skip-benchmarks"]
                ( "disable running benchmarks")
            | Opt( config.benchmarkSamples, "samples" )
                ["--benchmark-samples"]
                ( "number of samples to collect (default: 100)" )
            | Opt( config.benchmarkResamples, "resamples" )
                ["--benchmark-resamples"]
                ( "number of resamples for the bootstrap (default: 100000)" )
            | Opt( config.benchmarkConfidenceInterval, "confidence interval" )
                ["--benchmark-confidence-interval"]
                ( "confidence interval for the bootstrap (between 0 and 1, default: 0.95)" )
            | Opt( config.benchmarkNoAnalysis )
                ["--benchmark-no-analysis"]
                ( "perform only measurements; do not perform any analysis" )
            | Opt( config.benchmarkWarmupTime, "benchmarkWarmupTime" )
                ["--benchmark-warmup-time"]
                ( "amount of time in milliseconds spent on warming up each test (default: 100)" )
            | Opt( setShardCount, "shard count" )
                ["--shard-count"]
                ( "split the tests to execute into this many groups" )
            | Opt( setShardIndex, "shard index" )
                ["--shard-index"]
                ( "index of the group of tests to execute (see --shard-count)" )
            | Opt( config.allowZeroTests )
                ["--allow-running-no-tests"]
                ( "Treat 'No tests run' as a success" )
            | Arg( config.testsOrTags, "test name|pattern|tags" )
                ( "which test or tests to use" );

        return cli;
    }